

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugHookIdInfo(ImGuiID id,ImGuiDataType data_type,void *data_id,void *data_id_end)

{
  int iVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  uint *puVar4;
  ImGuiStackLevelInfo *pIVar5;
  size_t sVar6;
  uint local_bc;
  uint local_9c;
  ImGuiStackLevelInfo *info;
  undefined1 local_78 [4];
  int n;
  ImGuiStackTool *local_38;
  ImGuiStackTool *tool;
  ImGuiWindow *window;
  ImGuiContext *g;
  void *data_id_end_local;
  void *data_id_local;
  ImGuiDataType data_type_local;
  ImGuiID id_local;
  
  pIVar3 = GImGui;
  window = (ImGuiWindow *)GImGui;
  tool = (ImGuiStackTool *)GImGui->CurrentWindow;
  local_38 = &GImGui->DebugStackTool;
  g = (ImGuiContext *)data_id_end;
  data_id_end_local = data_id;
  data_id_local._0_4_ = data_type;
  data_id_local._4_4_ = id;
  if ((GImGui->DebugStackTool).StackLevel == -1) {
    (GImGui->DebugStackTool).StackLevel = (GImGui->DebugStackTool).StackLevel + 1;
    iVar1 = (((ImGuiWindow *)tool)->IDStack).Size;
    ImGuiStackLevelInfo::ImGuiStackLevelInfo((ImGuiStackLevelInfo *)local_78);
    ImVector<ImGuiStackLevelInfo>::resize
              (&(pIVar3->DebugStackTool).Results,iVar1 + 1,(ImGuiStackLevelInfo *)local_78);
    for (info._4_4_ = 0; info._4_4_ < *(int *)&tool[6].Results.Data + 1; info._4_4_ = info._4_4_ + 1
        ) {
      if (info._4_4_ < *(int *)&tool[6].Results.Data) {
        puVar4 = ImVector<unsigned_int>::operator[]
                           ((ImVector<unsigned_int> *)&tool[6].Results.Data,info._4_4_);
        local_9c = *puVar4;
      }
      else {
        local_9c = data_id_local._4_4_;
      }
      pIVar5 = ImVector<ImGuiStackLevelInfo>::operator[](&local_38->Results,info._4_4_);
      pIVar5->ID = local_9c;
    }
  }
  else {
    if ((GImGui->DebugStackTool).StackLevel < 0) {
      __assert_fail("tool->StackLevel >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x491f,
                    "void ImGui::DebugHookIdInfo(ImGuiID, ImGuiDataType, const void *, const void *)"
                   );
    }
    if ((GImGui->DebugStackTool).StackLevel == (((ImGuiWindow *)tool)->IDStack).Size) {
      pIVar5 = ImVector<ImGuiStackLevelInfo>::operator[]
                         (&(GImGui->DebugStackTool).Results,(GImGui->DebugStackTool).StackLevel);
      bVar2 = false;
      if (pIVar5->ID == data_id_local._4_4_) {
        bVar2 = '\0' < pIVar5->QueryFrameCount;
      }
      if (!bVar2) {
        __assert_fail("info->ID == id && info->QueryFrameCount > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                      ,0x4923,
                      "void ImGui::DebugHookIdInfo(ImGuiID, ImGuiDataType, const void *, const void *)"
                     );
      }
      switch((ImGuiDataType)data_id_local) {
      case 4:
        ImFormatString(pIVar5->Desc,0x39,"%d",(ulong)data_id_end_local & 0xffffffff);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                      ,0x4936,
                      "void ImGui::DebugHookIdInfo(ImGuiID, ImGuiDataType, const void *, const void *)"
                     );
      case 0xb:
        if (g == (ImGuiContext *)0x0) {
          sVar6 = strlen((char *)data_id_end_local);
          local_bc = (uint)sVar6;
        }
        else {
          local_bc = (int)g - (int)data_id_end_local;
        }
        ImFormatString(pIVar5->Desc,0x39,"%.*s",(ulong)local_bc,data_id_end_local);
        break;
      case 0xc:
        ImFormatString(pIVar5->Desc,0x39,"(void*)0x%p",data_id_end_local);
        break;
      case 0xd:
        if (pIVar5->Desc[0] != '\0') {
          return;
        }
        ImFormatString(pIVar5->Desc,0x39,"0x%08X [override]",(ulong)data_id_local._4_4_);
      }
      pIVar5->QuerySuccess = true;
      pIVar5->field_0x6 = (char)(ImGuiDataType)data_id_local;
    }
  }
  return;
}

Assistant:

void ImGui::DebugHookIdInfo(ImGuiID id, ImGuiDataType data_type, const void* data_id, const void* data_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackTool* tool = &g.DebugStackTool;

    // Step 0: stack query
    // This assume that the ID was computed with the current ID stack, which tends to be the case for our widget.
    if (tool->StackLevel == -1)
    {
        tool->StackLevel++;
        tool->Results.resize(window->IDStack.Size + 1, ImGuiStackLevelInfo());
        for (int n = 0; n < window->IDStack.Size + 1; n++)
            tool->Results[n].ID = (n < window->IDStack.Size) ? window->IDStack[n] : id;
        return;
    }

    // Step 1+: query for individual level
    IM_ASSERT(tool->StackLevel >= 0);
    if (tool->StackLevel != window->IDStack.Size)
        return;
    ImGuiStackLevelInfo* info = &tool->Results[tool->StackLevel];
    IM_ASSERT(info->ID == id && info->QueryFrameCount > 0);

    switch (data_type)
    {
    case ImGuiDataType_S32:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%d", (int)(intptr_t)data_id);
        break;
    case ImGuiDataType_String:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%.*s", data_id_end ? (int)((const char*)data_id_end - (const char*)data_id) : (int)strlen((const char*)data_id), (const char*)data_id);
        break;
    case ImGuiDataType_Pointer:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "(void*)0x%p", data_id);
        break;
    case ImGuiDataType_ID:
        if (info->Desc[0] != 0) // PushOverrideID() is often used to avoid hashing twice, which would lead to 2 calls to DebugHookIdInfo(). We prioritize the first one.
            return;
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "0x%08X [override]", id);
        break;
    default:
        IM_ASSERT(0);
    }
    info->QuerySuccess = true;
    info->DataType = data_type;
}